

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O0

void __thiscall Fl_Text_Editor::add_default_key_bindings(Fl_Text_Editor *this,Key_Binding **list)

{
  int local_1c;
  int i;
  Key_Binding **list_local;
  Fl_Text_Editor *this_local;
  
  local_1c = 0;
  while (default_key_bindings[local_1c].key != 0) {
    add_key_binding(this,default_key_bindings[local_1c].key,default_key_bindings[local_1c].state,
                    default_key_bindings[local_1c].func,list);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Fl_Text_Editor::add_default_key_bindings(Key_Binding** list) {
  for (int i = 0; default_key_bindings[i].key; i++) {
    add_key_binding(default_key_bindings[i].key,
                    default_key_bindings[i].state,
                    default_key_bindings[i].func,
                    list);
  }
}